

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void draw_v_arrow(int x,int y1,int y2)

{
  int iVar1;
  int dy;
  int y2_local;
  int y1_local;
  int x_local;
  
  iVar1 = 1;
  if (y2 < y1) {
    iVar1 = -1;
  }
  fl_yxline(x,y1,y2);
  fl_xyline(x + -4,y2,x + 4);
  fl_line(x + -2,y2 + iVar1 * -5,x,y2 - iVar1);
  fl_line(x + 2,y2 + iVar1 * -5,x,y2 - iVar1);
  return;
}

Assistant:

static void draw_v_arrow(int x, int y1, int y2) {
  int dy = (y1>y2) ? -1 : 1 ;
  fl_yxline(x, y1, y2);
  fl_xyline(x-4, y2, x+4);
  fl_line(x-2, y2-dy*5, x, y2-dy);
  fl_line(x+2, y2-dy*5, x, y2-dy);
}